

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local.c
# Opt level: O0

void local_proxy_opener_coroutine(void *vctx)

{
  Conf *pCVar1;
  SeatPromptResult spr_00;
  prompts_t *ppVar2;
  InteractionReadySeat iseat;
  char *pcVar3;
  strbuf *buf_o;
  char *msg;
  ptrlen pVar4;
  undefined8 in_stack_ffffffffffffff28;
  char *error_msg;
  char *cmd;
  strbuf *logmsg;
  char *censored_cmd;
  char *err;
  undefined1 local_48 [8];
  SeatPromptResult spr;
  uint flags;
  int *crLine;
  LocalProxyOpener *lp;
  void *vctx_local;
  
  if (*vctx == 0) {
    pcVar3 = format_telnet_command
                       (*(SockAddr **)((long)vctx + 0x20),*(int *)((long)vctx + 0x28),
                        *(Conf **)((long)vctx + 0x30),(uint *)&spr.field_0x1c);
    *(char **)((long)vctx + 0x10) = pcVar3;
    if ((*(long *)((long)vctx + 0x48) != 0) && ((spr._28_4_ & 3) != 0)) {
      burnstr(*(char **)((long)vctx + 0x10));
      *(undefined8 *)((long)vctx + 0x10) = 0;
      ppVar2 = new_prompts();
      *(prompts_t **)((long)vctx + 0x50) = ppVar2;
      *(code **)(*(long *)((long)vctx + 0x50) + 0x68) = local_proxy_opener_coroutine;
      *(void **)(*(long *)((long)vctx + 0x50) + 0x70) = vctx;
      **(undefined1 **)((long)vctx + 0x50) = 1;
      *(undefined1 *)(*(long *)((long)vctx + 0x50) + 1) = 0;
      pcVar3 = dupstr("Local proxy authentication");
      *(char **)(*(long *)((long)vctx + 0x50) + 8) = pcVar3;
      if ((spr._28_4_ & 1) == 0) {
        *(undefined4 *)((long)vctx + 0x58) = 0xffffffff;
      }
      else {
        *(int *)((long)vctx + 0x58) = (int)*(undefined8 *)(*(long *)((long)vctx + 0x50) + 0x28);
        ppVar2 = *(prompts_t **)((long)vctx + 0x50);
        pcVar3 = dupstr("Proxy username: ");
        add_prompt(ppVar2,pcVar3,true);
      }
      if ((spr._28_4_ & 2) == 0) {
        *(undefined4 *)((long)vctx + 0x5c) = 0xffffffff;
      }
      else {
        *(int *)((long)vctx + 0x5c) = (int)*(undefined8 *)(*(long *)((long)vctx + 0x50) + 0x28);
        ppVar2 = *(prompts_t **)((long)vctx + 0x50);
        pcVar3 = dupstr("Proxy password: ");
        add_prompt(ppVar2,pcVar3,false);
      }
      goto LAB_00162d15;
    }
  }
  else {
    if (*vctx != 0xa9) goto LAB_00163041;
LAB_00162d15:
    iseat = interactor_announce((Interactor *)((long)vctx + 0x60));
    seat_get_userpass_input((SeatPromptResult *)local_48,iseat,*(prompts_t **)((long)vctx + 0x50));
    if (local_48._0_4_ != SPRK_OK) {
      if (local_48._0_4_ == SPRK_USER_ABORT) {
        local_proxy_opener_cleanup_interactor((LocalProxyOpener *)vctx);
        plug_closing_user_abort(*(Plug **)((long)vctx + 0x18));
        return;
      }
      if (local_48._0_4_ == SPRK_SW_ABORT) {
        local_proxy_opener_cleanup_interactor((LocalProxyOpener *)vctx);
        spr_00.errfn = spr.errfn;
        spr_00.kind = spr.kind;
        spr_00._4_4_ = spr._4_4_;
        spr_00.errdata_lit = spr.errdata_lit;
        spr_00._24_8_ = in_stack_ffffffffffffff28;
        pcVar3 = spr_get_error_message(spr_00);
        plug_closing_error(*(Plug **)((long)vctx + 0x18),pcVar3);
        safefree(pcVar3);
        return;
      }
      *(undefined4 *)vctx = 0xa9;
      return;
    }
    if (*(int *)((long)vctx + 0x58) != -1) {
      pCVar1 = *(Conf **)((long)vctx + 0x30);
      pcVar3 = prompt_get_result_ref
                         (*(prompt_t **)
                           (*(long *)(*(long *)((long)vctx + 0x50) + 0x38) +
                           (long)*(int *)((long)vctx + 0x58) * 8));
      conf_set_str(pCVar1,0x10,pcVar3);
    }
    if (*(int *)((long)vctx + 0x5c) != -1) {
      pCVar1 = *(Conf **)((long)vctx + 0x30);
      pcVar3 = prompt_get_result_ref
                         (*(prompt_t **)
                           (*(long *)(*(long *)((long)vctx + 0x50) + 0x38) +
                           (long)*(int *)((long)vctx + 0x5c) * 8));
      conf_set_str(pCVar1,0x11,pcVar3);
    }
    free_prompts(*(prompts_t **)((long)vctx + 0x50));
    *(undefined8 *)((long)vctx + 0x50) = 0;
  }
  pcVar3 = format_telnet_command
                     (*(SockAddr **)((long)vctx + 0x20),*(int *)((long)vctx + 0x28),
                      *(Conf **)((long)vctx + 0x30),(uint *)0x0);
  *(char **)((long)vctx + 0x10) = pcVar3;
  conf_set_str(*(Conf **)((long)vctx + 0x30),0x11,"*password*");
  pcVar3 = format_telnet_command
                     (*(SockAddr **)((long)vctx + 0x20),*(int *)((long)vctx + 0x28),
                      *(Conf **)((long)vctx + 0x30),(uint *)0x0);
  buf_o = strbuf_new();
  pVar4 = make_ptrlen("Starting local proxy command: ",0x1e);
  BinarySink_put_datapl(buf_o->binarysink_,pVar4);
  pVar4 = ptrlen_from_asciz(pcVar3);
  BinarySink_put_c_string_literal(buf_o->binarysink_,pVar4);
  plug_log(*(Plug **)((long)vctx + 0x18),3,(SockAddr *)0x0,0,buf_o->s,0);
  strbuf_free(buf_o);
  safefree(pcVar3);
  pcVar3 = *(char **)((long)vctx + 0x10);
  *(undefined8 *)((long)vctx + 0x10) = 0;
  local_proxy_opener_cleanup_interactor((LocalProxyOpener *)vctx);
  msg = platform_setup_local_proxy(*(Socket **)((long)vctx + 8),pcVar3);
  burnstr(pcVar3);
  if (msg == (char *)0x0) {
    return;
  }
  plug_closing_error(*(Plug **)((long)vctx + 0x18),msg);
  safefree(msg);
LAB_00163041:
  *(undefined4 *)vctx = 0;
  return;
}

Assistant:

static void local_proxy_opener_coroutine(void *vctx)
{
    LocalProxyOpener *lp = (LocalProxyOpener *)vctx;

    crBegin(lp->crLine);

    /*
     * Make an initial attempt to figure out the command we want, and
     * see if it tried to include a username or password that we don't
     * have.
     */
    {
        unsigned flags;
        lp->formatted_cmd = format_telnet_command(
            lp->addr, lp->port, lp->conf, &flags);

        if (lp->clientseat && (flags & (TELNET_CMD_MISSING_USERNAME |
                                        TELNET_CMD_MISSING_PASSWORD))) {
            burnstr(lp->formatted_cmd);
            lp->formatted_cmd = NULL;

            /*
             * We're missing at least one of the two parts, and we
             * have an Interactor we can use to prompt for them, so
             * try it.
             */
            lp->prompts = new_prompts();
            lp->prompts->callback = local_proxy_opener_coroutine;
            lp->prompts->callback_ctx = lp;
            lp->prompts->to_server = true;
            lp->prompts->from_server = false;
            lp->prompts->name = dupstr("Local proxy authentication");
            if (flags & TELNET_CMD_MISSING_USERNAME) {
                lp->username_prompt_index = lp->prompts->n_prompts;
                add_prompt(lp->prompts, dupstr("Proxy username: "), true);
            } else {
                lp->username_prompt_index = -1;
            }
            if (flags & TELNET_CMD_MISSING_PASSWORD) {
                lp->password_prompt_index = lp->prompts->n_prompts;
                add_prompt(lp->prompts, dupstr("Proxy password: "), false);
            } else {
                lp->password_prompt_index = -1;
            }

            while (true) {
                SeatPromptResult spr = seat_get_userpass_input(
                    interactor_announce(&lp->interactor), lp->prompts);
                if (spr.kind == SPRK_OK) {
                    break;
                } else if (spr.kind == SPRK_USER_ABORT) {
                    local_proxy_opener_cleanup_interactor(lp);
                    plug_closing_user_abort(lp->plug);
                    /* That will have freed us, so we must just return
                     * without calling any crStop */
                    return;
                } else if (spr.kind == SPRK_SW_ABORT) {
                    local_proxy_opener_cleanup_interactor(lp);
                    char *err = spr_get_error_message(spr);
                    plug_closing_error(lp->plug, err);
                    sfree(err);
                    return; /* without crStop, as above */
                }
                crReturnV;
            }

            if (lp->username_prompt_index != -1) {
                conf_set_str(
                    lp->conf, CONF_proxy_username,
                    prompt_get_result_ref(
                        lp->prompts->prompts[lp->username_prompt_index]));
            }

            if (lp->password_prompt_index != -1) {
                conf_set_str(
                    lp->conf, CONF_proxy_password,
                    prompt_get_result_ref(
                        lp->prompts->prompts[lp->password_prompt_index]));
            }

            free_prompts(lp->prompts);
            lp->prompts = NULL;
        }

        /*
         * Now format the command a second time, with the results of
         * those prompts written into lp->conf.
         */
        lp->formatted_cmd = format_telnet_command(
            lp->addr, lp->port, lp->conf, NULL);
    }

    /*
     * Log the command, with some changes. Firstly, we regenerate it
     * with the password masked; secondly, we escape control
     * characters so that the log message is printable.
     */
    conf_set_str(lp->conf, CONF_proxy_password, "*password*");
    {
        char *censored_cmd = format_telnet_command(
            lp->addr, lp->port, lp->conf, NULL);

        strbuf *logmsg = strbuf_new();
        put_datapl(logmsg, PTRLEN_LITERAL("Starting local proxy command: "));
        put_c_string_literal(logmsg, ptrlen_from_asciz(censored_cmd));

        plug_log(lp->plug, PLUGLOG_PROXY_MSG, NULL, 0, logmsg->s, 0);
        strbuf_free(logmsg);
        sfree(censored_cmd);
    }

    /*
     * Now we're ready to actually do the platform-specific socket
     * setup.
     */
    char *cmd = lp->formatted_cmd;
    lp->formatted_cmd = NULL;

    local_proxy_opener_cleanup_interactor(lp);

    char *error_msg = platform_setup_local_proxy(lp->socket, cmd);
    burnstr(cmd);

    if (error_msg) {
        plug_closing_error(lp->plug, error_msg);
        sfree(error_msg);
    } else {
        /* If error_msg was NULL, there was no error in setup,
         * which means that platform_setup_local_proxy will have
         * called back to free us. So return without calling any
         * crStop. */
        return;
    }

    crFinishV;
}